

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTableSettings * __thiscall
ImChunkStream<ImGuiTableSettings>::alloc_chunk(ImChunkStream<ImGuiTableSettings> *this,size_t sz)

{
  int iVar1;
  char *__src;
  char *__dest;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = (this->Buf).Size;
  uVar4 = (int)sz + 7U & 0xfffffffc;
  iVar2 = iVar1 + uVar4;
  iVar3 = (this->Buf).Capacity;
  if (iVar3 < iVar2) {
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar3 <= iVar2) {
      iVar3 = iVar2;
    }
    __dest = (char *)ImGui::MemAlloc((long)iVar3);
    __src = (this->Buf).Data;
    if (__src != (char *)0x0) {
      memcpy(__dest,__src,(long)(this->Buf).Size);
      ImGui::MemFree((this->Buf).Data);
    }
    (this->Buf).Data = __dest;
    (this->Buf).Capacity = iVar3;
  }
  else {
    __dest = (this->Buf).Data;
  }
  (this->Buf).Size = iVar2;
  *(uint *)(__dest + iVar1) = uVar4;
  return (ImGuiTableSettings *)((this->Buf).Data + (long)iVar1 + 4);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = IM_MEMALIGN(HDR_SZ + sz, 4u); int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }